

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_bzip2.c
# Opt level: O0

int drive_compressor(archive_write_filter *f,private_data_conflict8 *data,int flush,void *src,
                    size_t length)

{
  anon_enum_32 aVar1;
  size_t sVar2;
  archive *a;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  size_t sStack_68;
  int ret;
  size_t zstdret;
  size_t opos;
  size_t ipos;
  ZSTD_inBuffer in;
  size_t length_local;
  void *src_local;
  int flush_local;
  private_data_conflict8 *data_local;
  archive_write_filter *f_local;
  
  in.size = 0;
  ipos = (size_t)src;
  in.src = (void *)length;
  in.pos = length;
  do {
    sVar3 = in.size;
    sVar2 = (data->out).pos;
    aVar1 = data->state;
    if (aVar1 == running) {
      if ((void *)in.size == in.src) {
        return 0;
      }
      sStack_68 = ZSTD_compressStream(data->cstream,&data->out,(ZSTD_inBuffer *)&ipos);
      uVar4 = ZSTD_isError(sStack_68);
      if (uVar4 != 0) {
LAB_001cbe7d:
        a = f->archive;
        pcVar6 = ZSTD_getErrorName(sStack_68);
        archive_set_error(a,-1,"Zstd compression failed: %s",pcVar6);
        return -0x1e;
      }
    }
    else if (aVar1 == finishing) {
      sStack_68 = ZSTD_endStream(data->cstream,&data->out);
      uVar4 = ZSTD_isError(sStack_68);
      if (uVar4 != 0) goto LAB_001cbe7d;
      if (sStack_68 == 0) {
        data->state = resetting;
      }
    }
    else if (aVar1 == resetting) {
      ZSTD_CCtx_reset(data->cstream,ZSTD_reset_session_only);
      data->cur_frame = data->cur_frame + 1;
      data->cur_frame_in = 0;
      data->cur_frame_out = 0;
      data->state = running;
    }
    data->total_in = (in.size - sVar3) + data->total_in;
    data->cur_frame_in = (in.size - sVar3) + data->cur_frame_in;
    data->cur_frame_out = ((data->out).pos - sVar2) + data->cur_frame_out;
    if ((data->state == running) && (data->max_frame_size <= data->cur_frame_in)) {
      data->state = finishing;
    }
    if (((data->out).pos == (data->out).size) || ((flush != 0 && ((data->out).pos != 0)))) {
      iVar5 = __archive_write_filter(f->next_filter,(data->out).dst,(data->out).pos);
      if (iVar5 != 0) {
        return -0x1e;
      }
      (data->out).pos = 0;
    }
  } while( true );
}

Assistant:

static int
drive_compressor(struct archive_write_filter *f,
    struct private_data *data, int finishing)
{
	int ret;

	for (;;) {
		if (data->stream.avail_out == 0) {
			ret = __archive_write_filter(f->next_filter,
			    data->compressed,
			    data->compressed_buffer_size);
			if (ret != ARCHIVE_OK) {
				/* TODO: Handle this write failure */
				return (ARCHIVE_FATAL);
			}
			data->stream.next_out = data->compressed;
			data->stream.avail_out = (uint32_t)data->compressed_buffer_size;
		}

		/* If there's nothing to do, we're done. */
		if (!finishing && data->stream.avail_in == 0)
			return (ARCHIVE_OK);

		ret = BZ2_bzCompress(&(data->stream),
		    finishing ? BZ_FINISH : BZ_RUN);

		switch (ret) {
		case BZ_RUN_OK:
			/* In non-finishing case, did compressor
			 * consume everything? */
			if (!finishing && data->stream.avail_in == 0)
				return (ARCHIVE_OK);
			break;
		case BZ_FINISH_OK:  /* Finishing: There's more work to do */
			break;
		case BZ_STREAM_END: /* Finishing: all done */
			/* Only occurs in finishing case */
			return (ARCHIVE_OK);
		default:
			/* Any other return value indicates an error */
			archive_set_error(f->archive,
			    ARCHIVE_ERRNO_PROGRAMMER,
			    "Bzip2 compression failed;"
			    " BZ2_bzCompress() returned %d",
			    ret);
			return (ARCHIVE_FATAL);
		}
	}
}